

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O1

uint8_t * apx_attributeParser_parse_initializer
                    (apx_attributeParser_t *self,uint8_t *begin,uint8_t *end,dtl_dv_t **dv)

{
  byte bVar1;
  uint8_t uVar2;
  dtl_av_t *self_00;
  _Bool _Var3;
  uint32_t uVar4;
  apx_attributeParseState_t *paVar5;
  byte *next;
  dtl_av_t *pdVar6;
  uint8_t *puVar7;
  ushort **ppuVar8;
  dtl_sv_t *pdVar9;
  byte *pbVar10;
  byte *next_00;
  long lVar11;
  long lVar12;
  
  if ((end == (uint8_t *)0x0 || (begin == (uint8_t *)0x0 || self == (apx_attributeParser_t *)0x0))
     || (dv == (dtl_dv_t **)0x0 || end < begin)) {
    return (uint8_t *)0x0;
  }
  apx_attributeParser_reset(self);
  paVar5 = (apx_attributeParseState_t *)malloc(0x18);
  if (paVar5 != (apx_attributeParseState_t *)0x0) {
    paVar5->parent = (apx_attributeParseState_tag *)0x0;
    paVar5->sv = (dtl_sv_t *)0x0;
    paVar5->initializer_list = (dtl_av_t *)0x0;
  }
  self->state = paVar5;
  if (paVar5 == (apx_attributeParseState_t *)0x0) {
    self->last_error = 2;
    self->error_next = begin;
  }
  if (begin < end) {
    next = bstr_lstrip(begin,end);
    bVar1 = *next;
    next_00 = next;
    if (bVar1 != 0) {
      if (bVar1 == 0x7b) {
        pdVar6 = dtl_av_new();
        paVar5 = self->state;
        paVar5->initializer_list = pdVar6;
        adt_stack_push(&self->stack,paVar5);
        paVar5 = (apx_attributeParseState_t *)malloc(0x18);
        if (paVar5 != (apx_attributeParseState_t *)0x0) {
          paVar5->parent = (apx_attributeParseState_tag *)0x0;
          paVar5->sv = (dtl_sv_t *)0x0;
          paVar5->initializer_list = (dtl_av_t *)0x0;
          paVar5->parent = self->state;
          self->state = paVar5;
          puVar7 = (uint8_t *)(*(code *)&LAB_00123903)();
          return puVar7;
        }
        self->last_error = 2;
        self->error_next = next + 1;
        puVar7 = (uint8_t *)(*(code *)&LAB_00123926)();
        return puVar7;
      }
      ppuVar8 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar8 + (ulong)bVar1 * 2 + 1) & 8) == 0) {
        if ((ulong)bVar1 == 0x22) {
          pdVar9 = dtl_sv_new();
          self->state->sv = pdVar9;
          if (end <= next) {
            __assert_fail("begin < end",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                          ,0x322,
                          "const uint8_t *apx_attributeParser_parse_string_literal(const uint8_t *, const uint8_t *, dtl_sv_t *)"
                         );
          }
          pbVar10 = bstr_match_pair(next,end,'\"','\"','\\');
          if (next < pbVar10) {
            if (end <= pbVar10) {
              __assert_fail("next < end",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                            ,0x326,
                            "const uint8_t *apx_attributeParser_parse_string_literal(const uint8_t *, const uint8_t *, dtl_sv_t *)"
                           );
            }
            dtl_sv_set_bstr(pdVar9,next + 1,pbVar10);
            pbVar10 = pbVar10 + 1;
          }
          if ((next < pbVar10) && (next_00 = pbVar10, end < pbVar10)) {
            __assert_fail("result <= end",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                          ,0x2fb,
                          "const uint8_t *apx_attributeParser_parse_scalar(apx_attributeParser_t *, const uint8_t *, const uint8_t *)"
                         );
          }
        }
        else if (bVar1 == 0x2d) {
          next_00 = next + 1;
          if (next_00 < end) {
            pdVar9 = dtl_sv_new();
            self->state->sv = pdVar9;
            pbVar10 = apx_attributeParser_parse_integer_literal(next_00,end,true,pdVar9);
            if ((next_00 < pbVar10) && (next_00 = pbVar10, end < pbVar10)) {
              __assert_fail("result <= end",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                            ,0x2eb,
                            "const uint8_t *apx_attributeParser_parse_scalar(apx_attributeParser_t *, const uint8_t *, const uint8_t *)"
                           );
            }
          }
          else {
            next_00 = (byte *)0x0;
          }
        }
      }
      else {
        pdVar9 = dtl_sv_new();
        self->state->sv = pdVar9;
        pbVar10 = apx_attributeParser_parse_integer_literal(next,end,false,pdVar9);
        if ((next < pbVar10) && (next_00 = pbVar10, end < pbVar10)) {
          __assert_fail("result <= end",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                        ,0x2dd,
                        "const uint8_t *apx_attributeParser_parse_scalar(apx_attributeParser_t *, const uint8_t *, const uint8_t *)"
                       );
        }
      }
    }
    if (next < next_00) {
      next = next_00;
    }
    if (next_00 == (byte *)0x0) {
LAB_001238ec:
      lVar11 = 1;
    }
    else {
      do {
        lVar11 = 3;
        if (self->state->parent == (apx_attributeParseState_tag *)0x0) break;
        puVar7 = bstr_lstrip(next,end);
        uVar2 = *puVar7;
        paVar5 = self->state;
        if ((paVar5 != (apx_attributeParseState_t *)0x0) &&
           (((pdVar6 = (dtl_av_t *)paVar5->sv, pdVar6 != (dtl_av_t *)0x0 ||
             (paVar5->initializer_list != (dtl_av_t *)0x0)) &&
            (paVar5->parent != (apx_attributeParseState_tag *)0x0)))) {
          self_00 = paVar5->parent->initializer_list;
          if (self_00 == (dtl_av_t *)0x0) {
            __assert_fail("self->state->parent->initializer_list != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                          ,700,
                          "_Bool apx_attributeParser_push_value_to_parent(apx_attributeParser_t *)")
            ;
          }
          lVar12 = 8;
          if (pdVar6 == (dtl_av_t *)0x0) {
            pdVar6 = paVar5->initializer_list;
            lVar12 = 0x10;
            if (pdVar6 == (dtl_av_t *)0x0) goto LAB_001238ec;
          }
          dtl_av_push(self_00,(dtl_dv_t *)pdVar6,false);
          *(undefined8 *)((long)&self->state->parent + lVar12) = 0;
        }
        _Var3 = dtl_av_is_empty(self->state->parent->initializer_list);
        if ((!_Var3) && (uVar2 == ',')) {
          puVar7 = (uint8_t *)(*(code *)&LAB_00123903)();
          return puVar7;
        }
        if (uVar2 != '}') goto LAB_001238ec;
        next = puVar7 + 1;
        uVar4 = adt_stack_size(&self->stack);
        if (uVar4 == 0) goto LAB_001238ec;
        paVar5 = self->state;
        if (paVar5 != (apx_attributeParseState_t *)0x0) {
          apx_attributeParseState_destroy(paVar5);
          free(paVar5);
        }
        paVar5 = (apx_attributeParseState_t *)adt_stack_top(&self->stack);
        self->state = paVar5;
        adt_stack_pop(&self->stack);
        uVar4 = adt_stack_size(&self->stack);
      } while (uVar4 != 0);
    }
    puVar7 = (uint8_t *)(*(code *)(&DAT_00141ef8 + *(int *)(&DAT_00141ef8 + lVar11 * 4)))();
    return puVar7;
  }
  puVar7 = bstr_lstrip(begin,end);
  if (begin < puVar7) {
    if (end < puVar7) {
      __assert_fail("next <= end",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                    ,0x150,
                    "const uint8_t *apx_attributeParser_parse_initializer(apx_attributeParser_t *, const uint8_t *, const uint8_t *, dtl_dv_t **)"
                   );
    }
    pdVar6 = self->state->initializer_list;
    lVar11 = 0x10;
    if (pdVar6 == (dtl_av_t *)0x0) {
      pdVar6 = (dtl_av_t *)self->state->sv;
      lVar11 = 8;
      if (pdVar6 == (dtl_av_t *)0x0) goto LAB_00123987;
    }
    *dv = (dtl_dv_t *)pdVar6;
    *(undefined8 *)((long)&self->state->parent + lVar11) = 0;
  }
LAB_00123987:
  if (puVar7 == (uint8_t *)0x0) {
    self->last_error = 3;
    self->error_next = begin;
  }
  paVar5 = self->state;
  if (paVar5 != (apx_attributeParseState_t *)0x0) {
    apx_attributeParseState_destroy(paVar5);
    free(paVar5);
  }
  self->state = (apx_attributeParseState_t *)0x0;
  return puVar7;
}

Assistant:

uint8_t const* apx_attributeParser_parse_initializer(apx_attributeParser_t* self, uint8_t const* begin, uint8_t const* end, dtl_dv_t** dv)
{
   if ((self != NULL) && (begin != NULL) && (end != NULL) && (begin <= end) && (dv != NULL))
   {
      uint8_t const* next;
      apx_attributeParser_reset(self);
      self->state = apx_attributeParseState_new();
      if (self->state == NULL)
      {
         apx_attributeParser_set_error(self, APX_MEM_ERROR, begin);
      }
      next = apx_attributeParser_parse_initializer_list(self, begin, end);
      if (next > begin)
      {
         assert(next <= end);
         if (self->state->initializer_list != NULL)
         {
            *dv = (dtl_dv_t*)self->state->initializer_list;
            self->state->initializer_list = NULL;
         }
         else if (self->state->sv != NULL)
         {
            *dv = (dtl_dv_t*)self->state->sv;
            self->state->sv = NULL;
         }
      }
      if (next == NULL)
      {
         apx_attributeParser_set_error(self, APX_PARSE_ERROR, begin);
      }
      apx_attributeParseState_delete(self->state);
      self->state = NULL;
      return next;
   }
   return NULL;
}